

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitRefFunc(I64ToI32Lowering *this,RefFunc *curr)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  Type *pTVar3;
  Type TVar4;
  Type TVar5;
  undefined1 auVar6 [8];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar7;
  Signature sig_00;
  HeapType local_88;
  value_type local_80;
  Type t;
  undefined1 local_70 [8];
  Signature sig;
  undefined1 auStack_58 [8];
  Iterator __begin2;
  undefined1 local_40 [8];
  Iterator __begin3;
  
  t.id = (uintptr_t)
         &(curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type;
  auStack_58 = (undefined1  [8])wasm::Type::getHeapType((Type *)t.id);
  _local_70 = HeapType::getSignature((HeapType *)auStack_58);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  auStack_58 = (undefined1  [8])local_70;
  PVar7 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          wasm::Type::end((Type *)local_70);
  pTVar3 = (Type *)0x0;
  auVar6 = (undefined1  [8])local_70;
  do {
    PVar1.index = (size_t)pTVar3;
    PVar1.parent = (Type *)auVar6;
    if (PVar7 == PVar1) {
      TVar5.id = (uintptr_t)local_70;
LAB_00a3b353:
      if (sig.params.id == 3) {
        TVar4.id = 2;
      }
      else {
        TVar4.id = sig.params.id;
        if ((undefined1  [8])TVar5.id == local_70) {
          return;
        }
      }
      sig_00.results.id = TVar4.id;
      sig_00.params.id = TVar5.id;
      HeapType::HeapType(&local_88,sig_00);
      TVar5 = t;
      TVar4 = wasm::Type::with(t.id,local_88);
      *(uintptr_t *)TVar5.id = TVar4.id;
      return;
    }
    pTVar3 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
    if (pTVar3->id == 3) {
      auStack_58 = (undefined1  [8])0x0;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_40 = (undefined1  [8])local_70;
      PVar7 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              wasm::Type::end((Type *)local_70);
      pTVar3 = (Type *)0x0;
      auVar6 = (undefined1  [8])local_70;
      while (PVar2.index = (size_t)pTVar3, PVar2.parent = (Type *)auVar6, PVar7 != PVar2) {
        pTVar3 = wasm::Type::Iterator::operator*((Iterator *)local_40);
        local_80.id = pTVar3->id;
        if (local_80.id == 3) {
          sig.results.id = 2;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&sig.results);
          sig.results.id = 2;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&sig.results);
        }
        else {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&local_80);
        }
        pTVar3 = (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
        auVar6 = local_40;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar3
        ;
      }
      wasm::Type::Type((Type *)local_40,(Tuple *)auStack_58);
      TVar5.id = (uintptr_t)local_40;
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
      goto LAB_00a3b353;
    }
    pTVar3 = (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
    auVar6 = auStack_58;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar3;
  } while( true );
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    auto sig = curr->type.getHeapType().getSignature();

    bool hasI64Param = false;
    for (auto t : sig.params) {
      if (t == Type::i64) {
        hasI64Param = true;
        break;
      }
    }
    auto params = sig.params;
    if (hasI64Param) {
      std::vector<Type> newParams;
      for (auto t : sig.params) {
        if (t == Type::i64) {
          newParams.push_back(Type::i32);
          newParams.push_back(Type::i32);
        } else {
          newParams.push_back(t);
        }
      }
      params = Type(newParams);
    };
    auto results = sig.results;
    // Update the results the same way we do when visiting functions. We use a
    // global rather than multivalue to lower i64 results.
    if (results == Type::i64) {
      results = Type::i32;
    }

    if (params != sig.params || results != sig.results) {
      curr->type = curr->type.with(HeapType(Signature(params, results)));
    }
  }